

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

wchar_t my_stricmp(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  char ch2;
  byte *pbStack_20;
  char ch1;
  char *s2_local;
  char *s1_local;
  
  s2_local = s1;
  for (pbStack_20 = (byte *)s2; (*s2_local != '\0' || (*pbStack_20 != 0));
      pbStack_20 = pbStack_20 + 1) {
    iVar1 = toupper((uint)(byte)*s2_local);
    iVar2 = toupper((uint)*pbStack_20);
    if ((char)iVar1 != (char)iVar2) {
      return (int)(char)iVar1 - (int)(char)iVar2;
    }
    s2_local = s2_local + 1;
  }
  return L'\0';
}

Assistant:

int my_stricmp(const char *s1, const char *s2)
{
	char ch1 = 0;
	char ch2 = 0;

	/* Just loop */
	while (true) {
		/* We've reached the end of both strings simultaneously */
		if ((*s1 == 0) && (*s2 == 0)) {
			/* We're still here, so s1 and s2 are equal */
			return (0);
		}

		ch1 = toupper((unsigned char) *s1);
		ch2 = toupper((unsigned char) *s2);

		/* If the characters don't match */
		if (ch1 != ch2) {
			/* return the difference between them */
			return ((int)(ch1 - ch2));
		}

		/* Step on through both strings */
		s1++;
		s2++;
	}
}